

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialAlgebraOperators.h
# Opt level: O3

SpatialRigidBodyInertia *
RigidBodyDynamics::Math::SpatialRigidBodyInertia::createFromMassComInertiaC
          (SpatialRigidBodyInertia *__return_storage_ptr__,Scalar mass,Vector3d *com,
          Matrix3d *inertia_C)

{
  Matrix3d I;
  Matrix3d *local_120;
  undefined8 *local_118;
  undefined8 *local_110;
  Scalar local_100;
  Matrix3_t local_e8;
  undefined8 local_a0;
  double local_98;
  double local_90;
  double dStack_88;
  undefined8 local_80;
  double local_78;
  double dStack_70;
  double local_68;
  undefined8 local_60;
  undefined8 local_58;
  double local_50;
  double local_48;
  double dStack_40;
  undefined8 local_38;
  double local_30;
  double dStack_28;
  double local_20;
  undefined8 local_18;
  
  __return_storage_ptr__->m = mass;
  local_78 = (com->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[0];
  dStack_70 = (com->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array[1];
  (__return_storage_ptr__->h).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       mass * local_78;
  (__return_storage_ptr__->h).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       mass * dStack_70;
  local_98 = (com->super_Vector3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
             m_storage.m_data.array[2];
  local_118 = &local_58;
  local_58 = 0;
  local_110 = &local_a0;
  local_a0 = 0;
  (__return_storage_ptr__->h).super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_98 * mass;
  local_68 = -local_78;
  local_38 = 0;
  local_90 = -dStack_70;
  dStack_88 = -local_98;
  local_18 = 0;
  local_80 = 0;
  local_60 = 0;
  local_120 = inertia_C;
  local_100 = mass;
  local_50 = local_98;
  local_48 = local_90;
  dStack_40 = dStack_88;
  local_30 = local_78;
  dStack_28 = dStack_70;
  local_20 = local_68;
  Matrix3_t::
  Matrix3_t<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>const>>
            (&local_e8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>_>
              *)&local_120);
  __return_storage_ptr__->Ixx =
       local_e8.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[0];
  __return_storage_ptr__->Iyx =
       local_e8.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[1];
  __return_storage_ptr__->Iyy =
       local_e8.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[4];
  __return_storage_ptr__->Izx =
       local_e8.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[2];
  __return_storage_ptr__->Izy =
       local_e8.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[5];
  __return_storage_ptr__->Izz =
       local_e8.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
       m_storage.m_data.array[8];
  return __return_storage_ptr__;
}

Assistant:

static SpatialRigidBodyInertia createFromMassComInertiaC (Scalar mass, const Vector3d &com, const Matrix3d &inertia_C) {
    SpatialRigidBodyInertia result;
    result.m = mass;
    result.h = com * mass;
    Matrix3d I = inertia_C + VectorCrossMatrix (com) * VectorCrossMatrix(com).transpose() * mass;
    result.Ixx = I(0,0);
    result.Iyx = I(1,0);
    result.Iyy = I(1,1);
    result.Izx = I(2,0);
    result.Izy = I(2,1);
    result.Izz = I(2,2);
    return result;
  }